

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvstore.cpp
# Opt level: O1

void __thiscall KVStore::reset(KVStore *this)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>_>_>
  *this_00;
  __nlink_t *p_Var1;
  pointer pcVar2;
  void *pvVar3;
  void *pvVar4;
  bool bVar5;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>_>_>
  *pmVar6;
  pointer pbVar7;
  __mode_t _Var8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  long *plVar12;
  undefined8 *puVar13;
  _Rb_tree_node_base *p_Var14;
  __nlink_t *p_Var15;
  ulong uVar16;
  uint __val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *file;
  pointer pbVar17;
  uint __len;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  pointer pbVar19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string dir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string __str_3;
  stat st;
  ulong *local_188;
  long local_180;
  ulong local_178 [2];
  long *local_168;
  long local_160;
  long local_158 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_148;
  ulong *local_128;
  long local_120;
  ulong local_118 [2];
  KVStore *local_108;
  string local_100;
  long *local_e0 [2];
  long local_d0 [2];
  stat local_c0;
  
  this->timeStamp = 0;
  this->fileNums = 0;
  SkipList::reset(&this->memTable);
  local_168 = local_158;
  pcVar2 = (this->storagePath)._M_dataplus._M_p;
  local_108 = this;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_168,pcVar2,pcVar2 + (this->storagePath)._M_string_length);
  std::__cxx11::string::append((char *)&local_168);
  p_Var1 = &local_c0.st_nlink;
  uVar11 = 0;
  do {
    local_e0[0] = local_d0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_e0,local_168,(char *)((long)local_168 + local_160));
    iVar10 = stat((char *)local_e0[0],&local_c0);
    _Var8 = local_c0.st_mode;
    if (local_e0[0] != local_d0) {
      operator_delete(local_e0[0],local_d0[0] + 1);
    }
    if ((iVar10 == 0 & (byte)(_Var8 >> 0xe) & 1) == 0) {
      this_00 = &local_108->cache;
      pmVar6 = &local_108->cache;
      for (p_Var14 = (local_108->cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var14 != &(pmVar6->_M_t)._M_impl.super__Rb_tree_header;
          p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14)) {
        pvVar3 = *(void **)(p_Var14 + 2);
        if (pvVar3 != (void *)0x0) {
          if (*(long **)((long)pvVar3 + 0x2838) != (long *)((long)pvVar3 + 0x2848)) {
            operator_delete(*(long **)((long)pvVar3 + 0x2838),*(long *)((long)pvVar3 + 0x2848) + 1);
          }
          pvVar4 = *(void **)((long)pvVar3 + 0x20);
          if (pvVar4 != (void *)0x0) {
            operator_delete(pvVar4,*(long *)((long)pvVar3 + 0x30) - (long)pvVar4);
          }
          operator_delete(pvVar3,0x2858);
        }
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>_>_>
      ::clear(&this_00->_M_t);
      if (local_168 != local_158) {
        operator_delete(local_168,local_158[0] + 1);
      }
      return;
    }
    local_148.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_148.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_148.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_100,local_168,(char *)((long)local_168 + local_160));
    utils::scanDir(&local_100,&local_148);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    pbVar7 = local_148.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar17 = local_148.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pbVar17 != pbVar7;
        pbVar17 = pbVar17 + 1) {
      local_188 = local_178;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_188,local_168,(char *)((long)local_168 + local_160));
      std::__cxx11::string::append((char *)&local_188);
      plVar12 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_188,(ulong)(pbVar17->_M_dataplus)._M_p);
      p_Var15 = (__nlink_t *)(plVar12 + 2);
      if ((__nlink_t *)*plVar12 == p_Var15) {
        local_c0.st_nlink = *p_Var15;
        local_c0._24_8_ = plVar12[3];
        local_c0.st_dev = (__dev_t)p_Var1;
      }
      else {
        local_c0.st_nlink = *p_Var15;
        local_c0.st_dev = (__dev_t)*plVar12;
      }
      local_c0.st_ino = plVar12[1];
      *plVar12 = (long)p_Var15;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      unlink((char *)local_c0.st_dev);
      if ((__nlink_t *)local_c0.st_dev != p_Var1) {
        operator_delete((void *)local_c0.st_dev,local_c0.st_nlink + 1);
      }
      if (local_188 != local_178) {
        operator_delete(local_188,local_178[0] + 1);
      }
    }
    rmdir((char *)local_168);
    pcVar2 = (local_108->storagePath)._M_dataplus._M_p;
    local_188 = local_178;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_188,pcVar2,pcVar2 + (local_108->storagePath)._M_string_length);
    std::__cxx11::string::append((char *)&local_188);
    __val = uVar11 + 1;
    __len = 1;
    if (8 < uVar11) {
      uVar11 = __val;
      uVar9 = 4;
      do {
        __len = uVar9;
        if (uVar11 < 100) {
          __len = __len - 2;
          goto LAB_001070be;
        }
        if (uVar11 < 1000) {
          __len = __len - 1;
          goto LAB_001070be;
        }
        if (uVar11 < 10000) goto LAB_001070be;
        bVar5 = 99999 < uVar11;
        uVar11 = uVar11 / 10000;
        uVar9 = __len + 4;
      } while (bVar5);
      __len = __len + 1;
    }
LAB_001070be:
    local_128 = local_118;
    std::__cxx11::string::_M_construct((ulong)&local_128,(char)__len);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_128,__len,__val);
    uVar16 = 0xf;
    if (local_188 != local_178) {
      uVar16 = local_178[0];
    }
    if (uVar16 < (ulong)(local_120 + local_180)) {
      uVar16 = 0xf;
      if (local_128 != local_118) {
        uVar16 = local_118[0];
      }
      if (uVar16 < (ulong)(local_120 + local_180)) goto LAB_00107125;
      puVar13 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_128,0,(char *)0x0,(ulong)local_188);
    }
    else {
LAB_00107125:
      puVar13 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_188,(ulong)local_128);
    }
    p_Var15 = puVar13 + 2;
    if ((__nlink_t *)*puVar13 == p_Var15) {
      local_c0.st_nlink = *p_Var15;
      local_c0._24_8_ = puVar13[3];
      local_c0.st_dev = (__dev_t)p_Var1;
    }
    else {
      local_c0.st_nlink = *p_Var15;
      local_c0.st_dev = (__dev_t)*puVar13;
    }
    local_c0.st_ino = puVar13[1];
    *puVar13 = p_Var15;
    puVar13[1] = 0;
    *(undefined1 *)p_Var15 = 0;
    std::__cxx11::string::operator=((string *)&local_168,(string *)&local_c0);
    if ((__nlink_t *)local_c0.st_dev != p_Var1) {
      operator_delete((void *)local_c0.st_dev,local_c0.st_nlink + 1);
    }
    if (local_128 != local_118) {
      operator_delete(local_128,local_118[0] + 1);
    }
    if (local_188 != local_178) {
      operator_delete(local_188,local_178[0] + 1);
    }
    pbVar7 = local_148.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar17 = local_148.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (local_148.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_148.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      paVar18 = &(local_148.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->field_2;
      do {
        plVar12 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (paVar18 + -1))->_M_dataplus)._M_p;
        if (paVar18 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar12) {
          operator_delete(plVar12,paVar18->_M_allocated_capacity + 1);
        }
        pbVar19 = (pointer)(paVar18 + 1);
        paVar18 = paVar18 + 2;
      } while (pbVar19 != pbVar7);
      local_148.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar17;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_148);
    uVar11 = __val;
  } while( true );
}

Assistant:

void KVStore::reset() {
  timeStamp = 0;
  fileNums = 0;

  memTable.reset();  // reset memTable

  // clean all SSTables
  string dir = storagePath + "/level-0";
  int level = 0;
  while (utils::dirExists(dir)) {
    vector<string> files;
    utils::scanDir(dir, files);
    for (const auto &file : files) utils::rmfile((dir + "/" + file).c_str());
    utils::rmdir(dir.c_str());
    dir = storagePath + "/level-" + to_string(++level);
    files.clear();
  }

  // clear all cache
  for (auto &c : cache) delete c.second;
  cache.clear();
}